

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

var __thiscall
cs::
make_cni<cs_impl::any(&)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&,cs::numeric_const&)>
          (cs *this,
          _func_any_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr_numeric_ptr *func,
          bool request_fold)

{
  undefined7 in_register_00000011;
  cni local_20;
  types local_14;
  
  local_20.mCni =
       cs_impl::cni::
       construct_helper<cs_impl::any(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&,cs::numeric_const&)>
       ::
       _construct<cs_impl::any(&)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&,cs::numeric_const&),cs_impl::any,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&,cs::numeric_const&>
                 (func,(_func_any_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr_numeric_ptr
                        *)0x0);
  local_14 = (types)CONCAT71(in_register_00000011,request_fold);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types>
            ((any *)this,&local_20,&local_14);
  if (local_20.mCni != (cni_holder_base *)0x0) {
    (*(local_20.mCni)->_vptr_cni_holder_base[1])();
  }
  return (var)(proxy *)this;
}

Assistant:

var make_cni(T &&func, bool request_fold = false)
	{
		return var::make_protect<callable>(cni(func),
		                                   request_fold ? callable::types::request_fold : callable::types::normal);
	}